

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nim.h
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
NimState::get_moves(vector<int,_std::allocator<int>_> *__return_storage_ptr__,NimState *this)

{
  int iVar1;
  undefined8 in_RAX;
  int iVar2;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  check_invariant(this);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = 1;
  while( true ) {
    uStack_28 = CONCAT44(iVar1,(undefined4)uStack_28);
    iVar2 = this->chips;
    if (2 < iVar2) {
      iVar2 = 3;
    }
    if (iVar2 < iVar1) break;
    std::vector<int,_std::allocator<int>_>::push_back
              (__return_storage_ptr__,(value_type_conflict *)((long)&uStack_28 + 4));
    iVar1 = uStack_28._4_4_ + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Move> get_moves() const
	{
		check_invariant();

		std::vector<Move> moves;
		for (Move move = 1; move <= std::min(3, chips); ++move) {
			moves.push_back(move);
		}
		return moves;
	}